

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

long __thiscall tetgenmesh::improvequalitybysmoothing(tetgenmesh *this,optparameters *opm)

{
  triface *searchtet;
  uint *puVar1;
  char *pcVar2;
  long lVar3;
  tetgenmesh *ptVar4;
  triface *ptVar5;
  int iVar6;
  arraypool *paVar7;
  undefined8 uVar8;
  long lVar9;
  arraypool *this_00;
  long lVar10;
  long lVar11;
  ulong uVar12;
  tetrahedron *pppdVar13;
  int local_94;
  long local_88;
  badface *parybface;
  long local_78;
  optparameters *local_70;
  tetgenmesh *local_68;
  tetrahedron *local_60;
  undefined8 local_58;
  arraypool *local_50;
  triface *local_48;
  int *local_40;
  ulong local_38;
  
  paVar7 = (arraypool *)operator_new(0x30);
  paVar7->objectbytes = 0x88;
  paVar7->objectsperblock = 0x400;
  paVar7->log2objectsperblock = 10;
  paVar7->objectsperblockmark = 0x3ff;
  paVar7->toparraylen = 0;
  paVar7->toparray = (char **)0x0;
  paVar7->objects = 0;
  paVar7->totalmemory = 0;
  local_78 = 0;
  uVar8 = 0;
  local_70 = opm;
  local_68 = this;
  do {
    this_00 = this->unflipqueue;
    this->unflipqueue = paVar7;
    local_58 = uVar8;
    if (this_00->objects < 1) goto LAB_001448f3;
    if (1 < this->b->verbose) {
      printf("    Improving mesh quality by smoothing [%d]#:  %ld.\n");
    }
    local_88 = 0;
    local_50 = this_00;
    for (lVar9 = 0; lVar9 < this_00->objects; lVar9 = lVar9 + 1) {
      pcVar2 = this_00->toparray[(uint)lVar9 >> ((byte)this_00->log2objectsperblock & 0x1f)];
      lVar11 = (long)this_00->objectbytes * (long)(int)(this_00->objectsperblockmark & (uint)lVar9);
      searchtet = (triface *)(pcVar2 + lVar11);
      iVar6 = gettetrahedron(this,*(point *)(pcVar2 + lVar11 + 0x58),
                             *(point *)(pcVar2 + lVar11 + 0x60),*(point *)(pcVar2 + lVar11 + 0x68),
                             *(point *)(pcVar2 + lVar11 + 0x70),searchtet);
      if ((iVar6 != 0) &&
         (pppdVar13 = searchtet->tet,
         (*(byte *)((long)pppdVar13 + (long)this->elemmarkerindex * 4) & 2) == 0)) {
        local_40 = &searchtet[2].ver;
        local_48 = searchtet + 2;
        tetalldihedral(this,(point)pppdVar13[4],(point)pppdVar13[5],(point)pppdVar13[6],
                       (point)pppdVar13[7],(double *)local_40,(double *)local_48,(double *)0x0);
        if ((double)searchtet[2].tet < this->cossmtdihed) {
          pppdVar13 = pppdVar13 + 4;
          opm->initval = (double)searchtet[2].tet + 1.0;
          local_94 = 0;
          for (uVar12 = 0; (local_94 == 0 && (uVar12 < 4)); uVar12 = uVar12 + 1) {
            local_94 = 0;
            if ((*(uint *)((long)pppdVar13[uVar12] + (long)this->pointmarkindex * 4 + 4) &
                0xffffff00) == 0x800) {
              getvertexstar(this,1,(point)pppdVar13[uVar12],this->cavetetlist,(arraypool *)0x0,
                            (arraypool *)0x0);
              opm->searchstep = 0.001;
              local_94 = smoothpoint(this,(point)pppdVar13[uVar12],this->cavetetlist,1,opm);
              if (local_94 != 0) {
                while (opm->smthiter == opm->maxiter) {
                  opm->searchstep = opm->searchstep * 10.0;
                  opm->initval = opm->imprval;
                  opm->smthiter = 0;
                  smoothpoint(this,(point)pppdVar13[uVar12],this->cavetetlist,1,opm);
                }
                local_88 = local_88 + 1;
                if (opm->imprval + -1.0 < this->cossmtdihed) {
                  local_38 = uVar12;
                  for (lVar11 = 0; ptVar5 = local_48, ptVar4 = local_68, paVar7 = this->cavetetlist,
                      this_00 = local_50, uVar12 = local_38, lVar11 < paVar7->objects;
                      lVar11 = lVar11 + 1) {
                    pcVar2 = paVar7->toparray
                             [(uint)lVar11 >> ((byte)paVar7->log2objectsperblock & 0x1f)];
                    lVar10 = (long)paVar7->objectbytes *
                             (long)(int)(paVar7->objectsperblockmark & (uint)lVar11);
                    lVar3 = *(long *)(pcVar2 + lVar10);
                    local_60 = pppdVar13;
                    if ((*(byte *)(lVar3 + (long)this->elemmarkerindex * 4) & 2) == 0) {
                      local_60 = (tetrahedron *)(lVar3 + 0x20);
                      tetalldihedral(local_68,*(point *)(lVar3 + 0x20),*(point *)(lVar3 + 0x28),
                                     *(point *)(lVar3 + 0x30),*(point *)(lVar3 + 0x38),
                                     (double *)local_40,(double *)local_48,(double *)0x0);
                      opm = local_70;
                      if ((double)ptVar5->tet <= ptVar4->cossmtdihed &&
                          ptVar4->cossmtdihed != (double)ptVar5->tet) {
                        puVar1 = (uint *)(*(long *)(pcVar2 + lVar10) +
                                         (long)ptVar4->elemmarkerindex * 4);
                        *puVar1 = *puVar1 | 2;
                        arraypool::newindex(ptVar4->unflipqueue,&parybface);
                        (parybface->tt).tet = *(tetrahedron **)(pcVar2 + lVar10);
                        parybface->forg = *(point *)(lVar3 + 0x20);
                        parybface->fdest = *(point *)(lVar3 + 0x28);
                        parybface->fapex = *(point *)(lVar3 + 0x30);
                        parybface->foppo = *(point *)(lVar3 + 0x38);
                        (parybface->tt).ver = 0xb;
                        parybface->key = 0.0;
                        opm = local_70;
                      }
                    }
                    pppdVar13 = local_60;
                    this = local_68;
                  }
                }
              }
              this->cavetetlist->objects = 0;
            }
          }
          if (local_94 == 0) {
            puVar1 = (uint *)((long)searchtet->tet + (long)this->elemmarkerindex * 4);
            *puVar1 = *puVar1 | 2;
            arraypool::newindex(this->unflipqueue,&parybface);
            (parybface->tt).tet = searchtet->tet;
            parybface->forg = (point)*pppdVar13;
            parybface->fdest = (point)pppdVar13[1];
            parybface->fapex = (point)pppdVar13[2];
            parybface->foppo = (point)pppdVar13[3];
            (parybface->tt).ver = 0xb;
            parybface->key = 0.0;
          }
        }
      }
    }
    this_00->objects = 0;
    paVar7 = this->unflipqueue;
    lVar9 = paVar7->objects;
    if (lVar9 < 1) {
      lVar9 = 0;
    }
    for (lVar11 = 0; lVar9 != lVar11; lVar11 = lVar11 + 1) {
      puVar1 = (uint *)(*(long *)(paVar7->toparray
                                  [(uint)lVar11 >> ((byte)paVar7->log2objectsperblock & 0x1f)] +
                                 (long)paVar7->objectbytes *
                                 (long)(int)(paVar7->objectsperblockmark & (uint)lVar11)) +
                       (long)this->elemmarkerindex * 4);
      *puVar1 = *puVar1 & 0xfffffffd;
    }
    if (1 < this->b->verbose) {
      printf("    Smooth %ld points.\n",local_88);
    }
    local_78 = local_78 + local_88;
    uVar8 = CONCAT71((int7)((ulong)local_88 >> 8),1);
    paVar7 = this_00;
  } while ((~(byte)local_58 & local_88 != 0) != 0);
  if (this_00 != (arraypool *)0x0) {
LAB_001448f3:
    arraypool::~arraypool(this_00);
  }
  operator_delete(this_00,0x30);
  return local_78;
}

Assistant:

long tetgenmesh::improvequalitybysmoothing(optparameters *opm)
{
  arraypool *flipqueue, *swapqueue;
  triface *parytet;
  badface *bface, *parybface;
  point *ppt;
  long totalsmtcount, smtcount;
  int smtflag;
  int iter, i, j, k;

  //assert(unflipqueue->objects > 0l);
  flipqueue = new arraypool(sizeof(badface), 10);

  // Swap the two flip queues.
  swapqueue = flipqueue;
  flipqueue = unflipqueue;
  unflipqueue = swapqueue;

  totalsmtcount = 0l;
  iter = 0;

  while (flipqueue->objects > 0l) {

    smtcount = 0l;

    if (b->verbose > 1) {
      printf("    Improving mesh quality by smoothing [%d]#:  %ld.\n",
             iter, flipqueue->objects);
    }

    for (k = 0; k < flipqueue->objects; k++) {      
      bface  = (badface *) fastlookup(flipqueue, k);
      if (gettetrahedron(bface->forg, bface->fdest, bface->fapex,
                         bface->foppo, &bface->tt)) {
        // Operate on it if it is not in 'unflipqueue'.
        if (!marktested(bface->tt)) {
          // Here we simply re-compute the quality. Since other smoothing
          //   operation may have moved the vertices of this tet.
          ppt = (point *) & (bface->tt.tet[4]);
          tetalldihedral(ppt[0], ppt[1], ppt[2], ppt[3], bface->cent, 
                         &bface->key, NULL);
          if (bface->key < cossmtdihed) { // if (maxdd < cosslidihed) {
            // It is a sliver. Try to smooth its vertices.
            smtflag = 0;
            opm->initval = bface->key + 1.0; 
            for (i = 0; (i < 4) && !smtflag; i++) {
              if (pointtype(ppt[i]) == FREEVOLVERTEX) {
                getvertexstar(1, ppt[i], cavetetlist, NULL, NULL);
                opm->searchstep = 0.001; // Search step size
                smtflag = smoothpoint(ppt[i], cavetetlist, 1, opm);
                if (smtflag) {
                  while (opm->smthiter == opm->maxiter) {
                    opm->searchstep *= 10.0; // Increase the step size.
                    opm->initval = opm->imprval;
                    opm->smthiter = 0; // reset
                    smoothpoint(ppt[i], cavetetlist, 1, opm);
                  }
                  // This tet is modifed.
                  smtcount++;
                  if ((opm->imprval - 1.0) < cossmtdihed) {
                    // There are slivers in new tets. Queue them.
                    for (j = 0; j < cavetetlist->objects; j++) {
                      parytet = (triface *) fastlookup(cavetetlist, j);
                      // Operate it if it is not in 'unflipqueue'.
                      if (!marktested(*parytet)) {
                        // Evaluate its quality.
                        // Re-use ppt, bface->key, bface->cent.
                        ppt = (point *) & (parytet->tet[4]);
                        tetalldihedral(ppt[0], ppt[1], ppt[2], ppt[3], 
                                       bface->cent, &bface->key, NULL);
                        if (bface->key < cossmtdihed) {
                          // A new sliver. Queue it.
                          marktest(*parytet); // It is in unflipqueue.
                          unflipqueue->newindex((void **) &parybface);
                          parybface->tt = *parytet;
                          parybface->forg = ppt[0];
                          parybface->fdest = ppt[1];
                          parybface->fapex = ppt[2];
                          parybface->foppo = ppt[3];
                          parybface->tt.ver = 11; 
                          parybface->key = 0.0;
                        }
                      }
                    } // j
                  } // if ((opm->imprval - 1.0) < cossmtdihed)
                } // if (smtflag)
                cavetetlist->restart();
              } // if (pointtype(ppt[i]) == FREEVOLVERTEX)
            } // i
            if (!smtflag) {
              // Didn't smooth. Queue it again.
              marktest(bface->tt); // It is in unflipqueue.
              unflipqueue->newindex((void **) &parybface);
              parybface->tt = bface->tt;
              parybface->forg = ppt[0];
              parybface->fdest = ppt[1];
              parybface->fapex = ppt[2];
              parybface->foppo = ppt[3];
              parybface->tt.ver = 11;
              parybface->key = 0.0;
            }
	      } // if (maxdd < cosslidihed)
        } // if (!marktested(...))
      } // if (gettetrahedron(...))
    } // k

    flipqueue->restart();

    // Unmark the tets in unflipqueue.
    for (i = 0; i < unflipqueue->objects; i++) {
      bface  = (badface *) fastlookup(unflipqueue, i);
      unmarktest(bface->tt);
    }

    if (b->verbose > 1) {
      printf("    Smooth %ld points.\n", smtcount);
    }
    totalsmtcount += smtcount;

    if (smtcount == 0l) {
      // No point has been smoothed. 
      break;
    } else {
      iter++;
      if (iter == 2) { //if (iter >= b->optpasses) {
        break;
      }
    }

    // Swap the two flip queues.
    swapqueue = flipqueue;
    flipqueue = unflipqueue;
    unflipqueue = swapqueue;
  } // while

  delete flipqueue;

  return totalsmtcount;
}